

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,_1,__1,_1,_1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>>
          (PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *this,
          DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  Index size;
  undefined8 *puVar6;
  Index index;
  ulong uVar7;
  long lVar8;
  
  lVar8 = *(long *)(*(long *)other + 8);
  if ((lVar8 != 0) &&
     (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar4 / SEXT816(lVar8),0) < 1)) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8,other,SUB168(auVar4 % SEXT816(lVar8),0));
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,1,lVar8);
  uVar2 = *(ulong *)(this + 8);
  if (uVar2 != *(ulong *)(*(long *)other + 8)) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, 1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 1, -1>, OtherDerived = Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  uVar7 = uVar2 - ((long)uVar2 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar2) {
    lVar8 = 0;
    do {
      puVar6 = (undefined8 *)(**(long **)other + lVar8 * 8);
      uVar5 = puVar6[1];
      puVar1 = (undefined8 *)(*(long *)this + lVar8 * 8);
      *puVar1 = *puVar6;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < (long)uVar2) {
    lVar8 = **(long **)other;
    lVar3 = *(long *)this;
    do {
      *(undefined8 *)(lVar3 + uVar7 * 8) = *(undefined8 *)(lVar8 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  if ((*(long *)this != 0) && (**(long **)other == *(long *)this)) {
    __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Transpose.h"
                  ,0x18a,
                  "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, 1, -1>, Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, 1, -1>, OtherDerived = Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, MightHaveTransposeAliasing = true]"
                 );
  }
  return (Matrix<double,_1,__1,_1,_1,__1> *)this;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }